

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O2

FileReader * __thiscall FDirectoryLump::NewReader(FDirectoryLump *this)

{
  FileReader *this_00;
  
  this_00 = (FileReader *)operator_new(0x30);
  FileReader::FileReader(this_00,(this->mFullPath).Chars);
  return this_00;
}

Assistant:

FileReader *FDirectoryLump::NewReader()
{
	try
	{
		return new FileReader(mFullPath);
	}
	catch (CRecoverableError &)
	{
		return NULL;
	}
}